

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralComparators.hpp
# Opt level: O0

Comparison __thiscall
Kernel::LiteralComparators::Negative::compare(Negative *this,Literal *l1,Literal *l2)

{
  bool bVar1;
  bool bVar2;
  LiteralSelector *in_RDI;
  bool l2N;
  bool l1N;
  Literal *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  bVar1 = LiteralSelector::isNegativeForSelection(in_RDI,in_stack_ffffffffffffffc8);
  bVar2 = LiteralSelector::isNegativeForSelection(in_RDI,in_stack_ffffffffffffffc8);
  if ((!bVar1) || (bVar2)) {
    if ((bVar1) || (!bVar2)) {
      local_4 = EQUAL;
    }
    else {
      local_4 = LESS;
    }
  }
  else {
    local_4 = GREATER;
  }
  return local_4;
}

Assistant:

Comparison compare(Literal* l1, Literal* l2)
  {
    ASS(_selector);

    bool l1N=_selector->isNegativeForSelection(l1);
    bool l2N=_selector->isNegativeForSelection(l2);
    if( l1N && !l2N ) {
      return GREATER;
    } else if( !l1N && l2N ) {
      return LESS;
    } else {
      return EQUAL;
    }
  }